

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void action_for_each_trigger(char *trigger,_func_void_action_ptr *func)

{
  int iVar1;
  code *in_RSI;
  char *in_RDI;
  action *act;
  listnode *node;
  listnode *local_18;
  
  for (local_18 = action_list.next; local_18 != &action_list; local_18 = local_18->next) {
    iVar1 = strcmp((char *)local_18[3].prev,in_RDI);
    if (iVar1 == 0) {
      (*in_RSI)(local_18);
    }
  }
  return;
}

Assistant:

void action_for_each_trigger(const char *trigger,
                             void (*func)(struct action *act))
{
    struct listnode *node;
    struct action *act;
    list_for_each(node, &action_list) {
        act = node_to_item(node, struct action, alist);
        if (!strcmp(act->name, trigger)) {
            func(act);
        }
    }
}